

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O2

thread __thiscall Incppect<true>::runAsync(Incppect<true> *this,Parameters *parameters)

{
  Parameters *in_RDX;
  undefined1 local_a8 [152];
  
  local_a8._0_8_ = parameters;
  Parameters::Parameters((Parameters *)(local_a8 + 8),in_RDX);
  std::thread::thread<Incppect<true>::runAsync(Incppect<true>::Parameters)::_lambda()_1_,,void>
            ((thread *)this,(anon_class_152_2_9f0aae65_for__M_head_impl *)local_a8);
  Parameters::~Parameters((Parameters *)(local_a8 + 8));
  return (thread)(id)this;
}

Assistant:

std::thread Incppect<SSL>::runAsync(Parameters parameters) {
    std::thread worker([this, parameters]() { this->run(parameters); });
    return worker;
}